

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar4;
  size_type sVar5;
  size_type sVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  
  lVar7 = std::__cxx11::string::rfind((char)arg,0x3d);
  if (lVar7 == -1) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    std::make_pair<std::__cxx11::string&,std::__cxx11::string>(&local_78,arg,&local_98);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)arg);
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffffc8,(ulong)arg);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (&local_78,&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffc8);
  }
  sVar6 = local_78.second._M_string_length;
  sVar5 = local_78.first._M_string_length;
  local_d8 = &local_c8;
  paVar1 = &local_78.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p == paVar1) {
    local_c8._8_8_ = local_78.first.field_2._8_8_;
  }
  else {
    local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_78.first._M_dataplus._M_p;
  }
  local_c8._M_allocated_capacity._1_7_ = local_78.first.field_2._M_allocated_capacity._1_7_;
  local_c8._M_local_buf[0] = local_78.first.field_2._M_local_buf[0];
  paVar2 = &local_78.second.field_2;
  local_b8 = &local_a8;
  local_78.first._M_dataplus._M_p = (pointer)paVar1;
  local_78.first._M_string_length = 0;
  local_78.first.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.second._M_dataplus._M_p == paVar2) {
    local_a8._8_8_ = local_78.second.field_2._8_8_;
  }
  else {
    local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_78.second._M_dataplus._M_p;
  }
  local_a8._M_allocated_capacity._1_7_ = local_78.second.field_2._M_allocated_capacity._1_7_;
  local_a8._M_local_buf[0] = local_78.second.field_2._M_local_buf[0];
  local_78.second._M_dataplus._M_p = (pointer)paVar2;
  local_78.second._M_string_length = 0;
  local_78.second.field_2._M_local_buf[0] = '\0';
  paVar8 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar8;
  if (local_d8 == &local_c8) {
    paVar8->_M_allocated_capacity = local_c8._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_c8._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)local_d8;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity = local_c8._M_allocated_capacity;
  }
  (__return_storage_ptr__->first)._M_string_length = sVar5;
  local_c8._M_allocated_capacity =
       (ulong)(uint7)local_78.first.field_2._M_allocated_capacity._1_7_ << 8;
  paVar8 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar8;
  if (local_b8 == &local_a8) {
    paVar8->_M_allocated_capacity = local_a8._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_a8._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)local_b8;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_a8._M_allocated_capacity;
  }
  (__return_storage_ptr__->second)._M_string_length = sVar6;
  local_a8._M_allocated_capacity =
       (ulong)(uint7)local_78.second.field_2._M_allocated_capacity._1_7_ << 8;
  if (lVar7 == -1) {
    ppVar4 = &local_78;
  }
  else {
    ppVar4 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffffc8;
  }
  paVar8 = &(ppVar4->first).field_2;
  local_78.second.field_2._M_local_buf[0] = '\0';
  local_78.second._M_string_length = 0;
  local_78.first.field_2._M_local_buf[0] = '\0';
  local_78.first._M_string_length = 0;
  local_b0 = 0;
  puVar3 = *(undefined1 **)(paVar8->_M_local_buf + -0x10);
  local_b8 = &local_a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 != paVar8) {
    operator_delete(puVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}